

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall
testing::internal::MatcherBase<const_phmap::priv::BitMask<unsigned_int,_16,_0>_&>::~MatcherBase
          (MatcherBase<const_phmap::priv::BitMask<unsigned_int,_16,_0>_&> *this)

{
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }